

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.h
# Opt level: O0

void * __thiscall
rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>::Malloc
          (MemoryPoolAllocator<rapidjson::CrtAllocator> *this,size_t size)

{
  bool bVar1;
  ulong uVar2;
  size_t local_38;
  void *buffer;
  size_t size_local;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *this_local;
  
  if (size == 0) {
    this_local = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0;
  }
  else {
    uVar2 = size + 7 & 0xfffffffffffffff8;
    if ((this->chunkHead_ == (ChunkHeader *)0x0) ||
       (this->chunkHead_->capacity < this->chunkHead_->size + uVar2)) {
      local_38 = uVar2;
      if (uVar2 < this->chunk_capacity_) {
        local_38 = this->chunk_capacity_;
      }
      bVar1 = AddChunk(this,local_38);
      if (!bVar1) {
        return (void *)0x0;
      }
    }
    this_local = (MemoryPoolAllocator<rapidjson::CrtAllocator> *)
                 ((long)&this->chunkHead_[1].capacity + this->chunkHead_->size);
    this->chunkHead_->size = uVar2 + this->chunkHead_->size;
  }
  return this_local;
}

Assistant:

void* Malloc(size_t size) {
        if (!size)
            return NULL;

        size = RAPIDJSON_ALIGN(size);
        if (chunkHead_ == 0 || chunkHead_->size + size > chunkHead_->capacity)
            if (!AddChunk(chunk_capacity_ > size ? chunk_capacity_ : size))
                return NULL;

        void *buffer = reinterpret_cast<char *>(chunkHead_) + RAPIDJSON_ALIGN(sizeof(ChunkHeader)) + chunkHead_->size;
        chunkHead_->size += size;
        return buffer;
    }